

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QModelIndex> * __thiscall
QList<QModelIndex>::operator+=(QList<QModelIndex> *this,QList<QModelIndex> *l)

{
  QList<QModelIndex> *in_RDI;
  QList<QModelIndex> *unaff_retaddr;
  
  append(unaff_retaddr,in_RDI);
  return in_RDI;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }